

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O2

int testDatumPushPopStringArray(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int local_148;
  VRStringArray b;
  VRStringArray c;
  VRStringArray g;
  VRStringArray f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  VRDatumStringArray a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_148 = 0;
  iVar11 = 10;
  while( true ) {
    bVar12 = iVar11 == 0;
    iVar11 = iVar11 + -1;
    if (bVar12) break;
    f.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    f.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    f.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&a,"one",(allocator<char> *)&b);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
    std::__cxx11::string::~string((string *)&a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&a,"two",(allocator<char> *)&b);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
    std::__cxx11::string::~string((string *)&a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&a,"three",(allocator<char> *)&b);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
    std::__cxx11::string::~string((string *)&a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&a,"four",(allocator<char> *)&b);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
    std::__cxx11::string::~string((string *)&a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&a,"five",(allocator<char> *)&b);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
    std::__cxx11::string::~string((string *)&a);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&f);
    MinVR::VRDatumStringArray::VRDatumStringArray(&a,&local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    a.
    super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    .needPush = true;
    a.
    super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    .stackFrame = a.
                  super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
                  .stackFrame + 1;
    g.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    g.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    g.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"six",(allocator<char> *)&c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"seven",(allocator<char> *)&c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"eight",(allocator<char> *)&c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"nine",(allocator<char> *)&c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"ten",(allocator<char> *)&c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&g);
    MinVR::
    VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    ::setValue((VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
                *)&a,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    (*a.
      super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
      .super_VRDatum_conflict._vptr_VRDatum[0xf])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
               (VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
                *)&a);
    iVar1 = std::__cxx11::string::compare
                      ((char *)b.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    iVar2 = std::__cxx11::string::compare
                      ((char *)(b.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    iVar3 = std::__cxx11::string::compare
                      ((char *)(b.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2));
    iVar4 = std::__cxx11::string::compare
                      ((char *)(b.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 3));
    iVar5 = std::__cxx11::string::compare
                      ((char *)(b.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4));
    MinVR::
    VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    ::pop((VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
           *)&a);
    (*a.
      super_VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
      .super_VRDatum_conflict._vptr_VRDatum[0xf])
              (&c,(VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
                   *)&a);
    iVar6 = std::__cxx11::string::compare
                      ((char *)c.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    iVar7 = std::__cxx11::string::compare
                      ((char *)(c.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    iVar8 = std::__cxx11::string::compare
                      ((char *)(c.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2));
    iVar9 = std::__cxx11::string::compare
                      ((char *)(c.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 3));
    iVar10 = std::__cxx11::string::compare
                       ((char *)(c.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4));
    local_148 = iVar10 + iVar9 + iVar8 +
                iVar7 + iVar5 + iVar6 + iVar3 + iVar4 + iVar1 + local_148 + iVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&g);
    MinVR::
    VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
    ::~VRDatumSpecialized
              ((VRDatumSpecialized<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(MinVR::VRCORETYPE_ID)6>
                *)&a);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&f);
  }
  return local_148;
}

Assistant:

int testDatumPushPopStringArray() {

  int out = 0;

  LOOP {

    MinVR::VRStringArray f;

    f.push_back("one");
    f.push_back("two");
    f.push_back("three");
    f.push_back("four");
    f.push_back("five");

    MinVR::VRDatumStringArray a = MinVR::VRDatumStringArray(f);

    a.push();

    MinVR::VRStringArray g;

    g.push_back("six");
    g.push_back("seven");
    g.push_back("eight");
    g.push_back("nine");
    g.push_back("ten");

    a.setValue(g);


    MinVR::VRStringArray b = a.getValue();

    out += b[0].compare("six");
    out += b[1].compare("seven");
    out += b[2].compare("eight");
    out += b[3].compare("nine");
    out += b[4].compare("ten");

    a.pop();

    MinVR::VRStringArray c = a.getValue();

    out += c[0].compare("one");
    out += c[1].compare("two");
    out += c[2].compare("three");
    out += c[3].compare("four");
    out += c[4].compare("five");

  }